

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

matrix sptk::swipe::zerom(int xSz,int ySz)

{
  matrix mVar1;
  double **ppdVar2;
  double *pdVar3;
  int in_ESI;
  int in_EDI;
  int i;
  matrix nw_matrix;
  int local_1c;
  
  ppdVar2 = (double **)malloc((long)in_EDI << 3);
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    pdVar3 = (double *)calloc(8,(long)in_ESI);
    ppdVar2[local_1c] = pdVar3;
  }
  mVar1.y = in_ESI;
  mVar1.x = in_EDI;
  mVar1.m = ppdVar2;
  return mVar1;
}

Assistant:

matrix zerom(int xSz, int ySz) {
    matrix nw_matrix;
    nw_matrix.x = xSz;
    nw_matrix.y = ySz;
#if 0
    nw_matrix.m = malloc(sizeof(double*) * xSz);
#else
    nw_matrix.m = (double**) malloc(sizeof(double*) * xSz);
#endif
    int i;
    for (i = 0; i < nw_matrix.x; i++)
#if 0
        nw_matrix.m[i] = calloc(sizeof(double), ySz);
#else
        nw_matrix.m[i] = (double*) calloc(sizeof(double), ySz);
#endif
    return(nw_matrix);
}